

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O3

aiReturn aiGetMaterialFloatArray
                   (aiMaterial *pMat,char *pKey,uint type,uint index,ai_real *pOut,uint *pMax)

{
  char *c;
  Logger *this;
  long *plVar1;
  uint uVar2;
  long *plVar3;
  aiReturn aVar4;
  ulong uVar5;
  float *out;
  aiMaterialProperty *prop;
  allocator local_99;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  aiMaterialProperty *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (pOut == (ai_real *)0x0) {
    __assert_fail("pOut != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                  ,99,
                  "aiReturn aiGetMaterialFloatArray(const aiMaterial *, const char *, unsigned int, unsigned int, ai_real *, unsigned int *)"
                 );
  }
  if (pMat != (aiMaterial *)0x0) {
    aiGetMaterialProperty(pMat,pKey,type,index,&local_58);
    aVar4 = aiReturn_FAILURE;
    if (local_58 != (aiMaterialProperty *)0x0) {
      switch(local_58->mType) {
      case aiPTI_Float:
      case aiPTI_Buffer:
        uVar2 = local_58->mDataLength >> 2;
        if ((pMax != (uint *)0x0) && (*pMax <= uVar2)) {
          uVar2 = *pMax;
        }
        if (uVar2 != 0) {
          uVar5 = 0;
          do {
            pOut[uVar5] = *(ai_real *)(local_58->mData + uVar5 * 4);
            uVar5 = uVar5 + 1;
          } while (uVar2 != uVar5);
        }
        break;
      case aiPTI_Double:
        uVar2 = local_58->mDataLength >> 3;
        if ((pMax != (uint *)0x0) && (*pMax <= uVar2)) {
          uVar2 = *pMax;
        }
        if (uVar2 != 0) {
          uVar5 = 0;
          do {
            pOut[uVar5] = (float)*(double *)(local_58->mData + uVar5 * 8);
            uVar5 = uVar5 + 1;
          } while (uVar2 != uVar5);
        }
        break;
      default:
        if (pMax == (uint *)0x0) {
          uVar2 = 0;
        }
        else {
          uVar2 = *pMax;
        }
        if (4 < local_58->mDataLength) {
          if (local_58->mData[local_58->mDataLength - 1] != '\0') {
            __assert_fail("!prop->mData[ prop->mDataLength - 1 ]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                          ,0x9e,
                          "aiReturn aiGetMaterialFloatArray(const aiMaterial *, const char *, unsigned int, unsigned int, ai_real *, unsigned int *)"
                         );
          }
          c = Assimp::fast_atoreal_move<float>(local_58->mData + 4,pOut,true);
          if (uVar2 - 1 != 0) {
            uVar5 = (ulong)(uVar2 - 1);
            out = pOut + 1;
            do {
              if ((*c != '\t') && (*c != ' ')) {
                this = Assimp::DefaultLogger::get();
                std::__cxx11::string::string((string *)local_50,pKey,&local_99);
                plVar1 = (long *)std::__cxx11::string::replace
                                           ((ulong)local_50,0,(char *)0x0,0x1efeb3);
                plVar3 = plVar1 + 2;
                if ((long *)*plVar1 == plVar3) {
                  local_88 = *plVar3;
                  lStack_80 = plVar1[3];
                  local_98 = &local_88;
                }
                else {
                  local_88 = *plVar3;
                  local_98 = (long *)*plVar1;
                }
                local_90 = plVar1[1];
                *plVar1 = (long)plVar3;
                plVar1[1] = 0;
                *(undefined1 *)(plVar1 + 2) = 0;
                plVar1 = (long *)std::__cxx11::string::append((char *)&local_98);
                plVar3 = plVar1 + 2;
                if ((long *)*plVar1 == plVar3) {
                  local_68 = *plVar3;
                  lStack_60 = plVar1[3];
                  local_78 = &local_68;
                }
                else {
                  local_68 = *plVar3;
                  local_78 = (long *)*plVar1;
                }
                local_70 = plVar1[1];
                *plVar1 = (long)plVar3;
                plVar1[1] = 0;
                *(undefined1 *)(plVar1 + 2) = 0;
                Assimp::Logger::error(this,(char *)local_78);
                if (local_78 != &local_68) {
                  operator_delete(local_78);
                }
                if (local_98 != &local_88) {
                  operator_delete(local_98);
                }
                if (local_50[0] == local_40) {
                  return aiReturn_FAILURE;
                }
                operator_delete(local_50[0]);
                return aiReturn_FAILURE;
              }
              c = Assimp::fast_atoreal_move<float>(c,out,true);
              out = out + 1;
              uVar5 = uVar5 - 1;
            } while (uVar5 != 0);
          }
          if (pMax == (uint *)0x0) {
            return aiReturn_SUCCESS;
          }
          *pMax = uVar2;
          return aiReturn_SUCCESS;
        }
        __assert_fail("prop->mDataLength >= 5",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                      ,0x9d,
                      "aiReturn aiGetMaterialFloatArray(const aiMaterial *, const char *, unsigned int, unsigned int, ai_real *, unsigned int *)"
                     );
      case aiPTI_Integer:
        uVar2 = local_58->mDataLength >> 2;
        if ((pMax != (uint *)0x0) && (*pMax <= uVar2)) {
          uVar2 = *pMax;
        }
        if (uVar2 != 0) {
          uVar5 = 0;
          do {
            pOut[uVar5] = (float)*(int *)(local_58->mData + uVar5 * 4);
            uVar5 = uVar5 + 1;
          } while (uVar2 != uVar5);
        }
      }
      aVar4 = aiReturn_SUCCESS;
      if (pMax != (uint *)0x0) {
        *pMax = uVar2;
      }
    }
    return aVar4;
  }
  __assert_fail("pMat != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                ,100,
                "aiReturn aiGetMaterialFloatArray(const aiMaterial *, const char *, unsigned int, unsigned int, ai_real *, unsigned int *)"
               );
}

Assistant:

aiReturn aiGetMaterialFloatArray(const aiMaterial* pMat,
    const char* pKey,
    unsigned int type,
    unsigned int index,
    ai_real* pOut,
    unsigned int* pMax)
{
    ai_assert( pOut != nullptr );
    ai_assert( pMat != nullptr );

    const aiMaterialProperty* prop;
    aiGetMaterialProperty(pMat,pKey,type,index, (const aiMaterialProperty**) &prop);
    if ( nullptr == prop) {
        return AI_FAILURE;
    }

    // data is given in floats, convert to ai_real
    unsigned int iWrite = 0;
    if( aiPTI_Float == prop->mType || aiPTI_Buffer == prop->mType)  {
        iWrite = prop->mDataLength / sizeof(float);
        if (pMax) {
            iWrite = std::min(*pMax,iWrite); ;
        }

        for (unsigned int a = 0; a < iWrite; ++a) {
            pOut[ a ] = static_cast<ai_real> ( reinterpret_cast<float*>(prop->mData)[a] );
        }

        if (pMax) {
            *pMax = iWrite;
        }
    }
    // data is given in doubles, convert to float
    else if( aiPTI_Double == prop->mType)  {
        iWrite = prop->mDataLength / sizeof(double);
        if (pMax) {
            iWrite = std::min(*pMax,iWrite); ;
        }
        for (unsigned int a = 0; a < iWrite;++a)    {
            pOut[a] = static_cast<ai_real> ( reinterpret_cast<double*>(prop->mData)[a] );
        }
        if (pMax) {
            *pMax = iWrite;
        }
    }
    // data is given in ints, convert to float
    else if( aiPTI_Integer == prop->mType)  {
        iWrite = prop->mDataLength / sizeof(int32_t);
        if (pMax) {
            iWrite = std::min(*pMax,iWrite); ;
        }
        for (unsigned int a = 0; a < iWrite;++a)    {
            pOut[a] = static_cast<ai_real> ( reinterpret_cast<int32_t*>(prop->mData)[a] );
        }
        if (pMax) {
            *pMax = iWrite;
        }
    }
    // a string ... read floats separated by spaces
    else {
        if (pMax) {
            iWrite = *pMax;
        }
        // strings are zero-terminated with a 32 bit length prefix, so this is safe
        const char *cur = prop->mData + 4;
        ai_assert( prop->mDataLength >= 5 );
        ai_assert( !prop->mData[ prop->mDataLength - 1 ] );
        for ( unsigned int a = 0; ;++a) {
            cur = fast_atoreal_move<ai_real>(cur,pOut[a]);
            if ( a==iWrite-1 ) {
                break;
            }
            if ( !IsSpace(*cur) ) {
                ASSIMP_LOG_ERROR("Material property" + std::string(pKey) +
                    " is a string; failed to parse a float array out of it.");
                return AI_FAILURE;
            }
        }

        if (pMax) {
            *pMax = iWrite;
        }
    }
    return AI_SUCCESS;
}